

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

FunctionPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionPortListSyntax,slang::syntax::FunctionPortListSyntax_const&>
          (BumpAllocator *this,FunctionPortListSyntax *args)

{
  FunctionPortListSyntax *pFVar1;
  FunctionPortListSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pFVar1 = (FunctionPortListSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::FunctionPortListSyntax::FunctionPortListSyntax(in_RSI,pFVar1);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }